

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_ToggleMap(void)

{
  uint uVar1;
  int iVar2;
  
  if ((gamestate == GS_LEVEL) &&
     (uVar1 = FIntCVar::operator_cast_to_int(&dmflags2), (uVar1 & 0x40000) == 0)) {
    ST_SetNeedRefresh();
    if ((automapactive & 1U) == 0) {
      AM_Start();
      iVar2 = FIntCVar::operator_cast_to_int(&am_overlay);
      viewactive = (float)iVar2 != 0.0;
    }
    else {
      iVar2 = FIntCVar::operator_cast_to_int(&am_overlay);
      if ((iVar2 == 1) && ((viewactive & 1U) != 0)) {
        viewactive = false;
        ST_SetNeedRefresh();
      }
      else {
        AM_Stop();
      }
    }
  }
  return;
}

Assistant:

void AM_ToggleMap ()
{
	if (gamestate != GS_LEVEL)
		return;

	// Don't activate the automap if we're not allowed to use it.
	if (dmflags2 & DF2_NO_AUTOMAP)
		return;

	ST_SetNeedRefresh();
	if (!automapactive)
	{
		AM_Start ();
		viewactive = (am_overlay != 0.f);
	}
	else
	{
		if (am_overlay==1 && viewactive)
		{
			viewactive = false;
			ST_SetNeedRefresh();
		}
		else
		{
			AM_Stop ();
		}
	}
}